

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.h
# Opt level: O0

void __thiscall absl::Cord::ChunkIterator::InitTree(ChunkIterator *this,CordRep *tree)

{
  CordRep *edge;
  CordRepBtree *tree_00;
  string_view sVar1;
  size_t local_38;
  char *local_30;
  size_t local_28;
  char *local_20;
  CordRep *tree_local;
  ChunkIterator *this_local;
  
  edge = cord_internal::SkipCrcNode(tree);
  if (edge->tag == '\x03') {
    tree_00 = cord_internal::CordRep::btree(edge);
    sVar1 = cord_internal::CordRepBtreeReader::Init(&this->btree_reader_,tree_00);
    local_28 = sVar1._M_len;
    (this->current_chunk_)._M_len = local_28;
    local_20 = sVar1._M_str;
    (this->current_chunk_)._M_str = local_20;
  }
  else {
    this->current_leaf_ = edge;
    sVar1 = cord_internal::EdgeData(edge);
    local_38 = sVar1._M_len;
    (this->current_chunk_)._M_len = local_38;
    local_30 = sVar1._M_str;
    (this->current_chunk_)._M_str = local_30;
  }
  return;
}

Assistant:

inline void Cord::ChunkIterator::InitTree(
    cord_internal::CordRep* absl_nonnull tree) {
  tree = cord_internal::SkipCrcNode(tree);
  if (tree->tag == cord_internal::BTREE) {
    current_chunk_ = btree_reader_.Init(tree->btree());
  } else {
    current_leaf_ = tree;
    current_chunk_ = cord_internal::EdgeData(tree);
  }
}